

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_script.cpp
# Opt level: O0

void __thiscall
cfdcapi_script_TapscriptTreeAddTree2_Test::~cfdcapi_script_TapscriptTreeAddTree2_Test
          (cfdcapi_script_TapscriptTreeAddTree2_Test *this)

{
  void *in_RDI;
  
  ~cfdcapi_script_TapscriptTreeAddTree2_Test((cfdcapi_script_TapscriptTreeAddTree2_Test *)0x3b5e48);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(cfdcapi_script, TapscriptTreeAddTree2) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int tmp_ret = 0;
  void* tree_handle1 = nullptr;
  ret = CfdInitializeTaprootScriptTree(handle, &tree_handle1);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    ret = CfdSetInitialTapLeaf(handle, tree_handle1,
        "20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac",
        0xc0);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddTapBranchByTapLeaf(handle, tree_handle1,
        "51",
        0xc0);
    EXPECT_EQ(kCfdSuccess, ret);

    void* tree_handle2 = nullptr;
    ret = CfdInitializeTaprootScriptTree(handle, &tree_handle2);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      ret = CfdSetInitialTapLeaf(handle, tree_handle2,
          "2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac",
          0xc0);
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdAddTapBranchByScriptTree(handle, tree_handle2, tree_handle1);
      EXPECT_EQ(kCfdSuccess, ret);

      uint32_t branch_count = 0;
      ret = CfdGetTapBranchCount(handle, tree_handle2, &branch_count);
      EXPECT_EQ(kCfdSuccess, ret);
      EXPECT_EQ(1, branch_count);

      char* tree_str = nullptr;
      ret = CfdGetTaprootScriptTreeSrting(handle, tree_handle2, &tree_str);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ(
          "{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}",
          tree_str);
        CfdFreeStringBuffer(tree_str);
        tree_str = nullptr;
      }

      tmp_ret = CfdFreeTaprootScriptTreeHandle(handle, tree_handle2);
      EXPECT_EQ(kCfdSuccess, tmp_ret);
    }

    tmp_ret = CfdFreeTaprootScriptTreeHandle(handle, tree_handle1);
    EXPECT_EQ(kCfdSuccess, tmp_ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}